

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFlyAnimation(comparer_context *comp)

{
  scoped_chunk chunk;
  sliced_chunk_reader reader;
  sliced_chunk_iterator it;
  allocator<char> local_441;
  scoped_chunk local_440;
  string local_438;
  undefined1 local_418 [1032];
  
  local_440.ctx = comp;
  comparer_context::push_elem(comp,"aiAnimation");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"mName",&local_441);
  comparer_context::cmp<aiString>((aiString *)local_418,comp,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_418,"mDuration",(allocator<char> *)&local_438);
  comparer_context::cmp<double>(comp,(string *)local_418);
  std::__cxx11::string::~string((string *)local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_418,"mTicksPerSecond",(allocator<char> *)&local_438);
  comparer_context::cmp<double>(comp,(string *)local_418);
  std::__cxx11::string::~string((string *)local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_418,"mNumChannels",(allocator<char> *)&local_438);
  comparer_context::cmp<unsigned_int>(comp,(string *)local_418);
  std::__cxx11::string::~string((string *)local_418);
  local_438._M_dataplus._M_p = (pointer)comp;
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_418,(sliced_chunk_reader *)&local_438);
  while (local_418[0x10] != '\x01') {
    if (local_418._8_4_ == 0x1238) {
      CompareOnTheFlyNodeAnim(comp);
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_418);
  }
  sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_418);
  scoped_chunk::~scoped_chunk(&local_440);
  return;
}

Assistant:

void CompareOnTheFlyAnimation(comparer_context& comp)   {
    scoped_chunk chunk(comp,"aiAnimation");

    comp.cmp<aiString>("mName");
    comp.cmp<double>("mDuration");
    comp.cmp<double>("mTicksPerSecond");
    comp.cmp<uint32_t>("mNumChannels");

    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AINODEANIM) {
            CompareOnTheFlyNodeAnim(comp);
        }
    }
}